

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaAllocator_T::PrintDetailedMap(VmaAllocator_T *this,VmaJsonWriter *json)

{
  VmaBlockVector *this_00;
  ItemType *this_01;
  bool bVar1;
  VmaBlockVector *blockVector;
  PoolList *pPVar2;
  long lVar3;
  uint32_t memTypeIndex;
  ulong uVar4;
  uint32_t memTypeIndex_1;
  uint n;
  VmaMutexLockRead lock;
  VmaMutexLockRead local_40;
  PoolList *local_38;
  
  VmaJsonWriter::WriteString(json,"DefaultPools");
  VmaJsonWriter::BeginObject(json,false);
  lVar3 = 0x710;
  for (uVar4 = 0; uVar4 < (this->m_MemProps).memoryTypeCount; uVar4 = uVar4 + 1) {
    this_00 = this->m_pBlockVectors[uVar4];
    if (this_00 != (VmaBlockVector *)0x0) {
      VmaJsonWriter::BeginString(json,"Type ");
      VmaJsonWriter::ContinueString(json,(uint32_t)uVar4);
      VmaJsonWriter::EndString(json,(char *)0x0);
      VmaJsonWriter::BeginObject(json,false);
      VmaJsonWriter::WriteString(json,"PreferredBlockSize");
      VmaJsonWriter::WriteNumber(json,this_00->m_PreferredBlockSize);
      VmaJsonWriter::WriteString(json,"Blocks");
      VmaBlockVector::PrintDetailedMap(this_00,json);
      VmaJsonWriter::WriteString(json,"DedicatedAllocations");
      VmaDedicatedAllocationList::BuildStatsString
                ((VmaDedicatedAllocationList *)(&this->m_UseMutex + lVar3),json);
      VmaJsonWriter::EndObject(json);
    }
    lVar3 = lVar3 + 0x58;
  }
  VmaJsonWriter::EndObject(json);
  VmaJsonWriter::WriteString(json,"CustomPools");
  VmaJsonWriter::BeginObject(json,false);
  local_40.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_40.m_pMutex = &this->m_PoolsMutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_PoolsMutex);
  }
  if ((this->m_Pools).m_Count != 0) {
    local_38 = &this->m_Pools;
    for (n = 0; n < (this->m_MemProps).memoryTypeCount; n = n + 1) {
      bVar1 = true;
      pPVar2 = local_38;
      while (this_01 = pPVar2->m_Front, this_01 != (ItemType *)0x0) {
        if ((this_01->m_BlockVector).m_MemoryTypeIndex == n) {
          if (bVar1) {
            VmaJsonWriter::BeginString(json,"Type ");
            VmaJsonWriter::ContinueString(json,n);
            VmaJsonWriter::EndString(json,(char *)0x0);
            bVar1 = false;
            VmaJsonWriter::BeginArray(json,false);
          }
          VmaJsonWriter::BeginObject(json,false);
          VmaJsonWriter::WriteString(json,"Name");
          VmaJsonWriter::BeginString(json,(char *)0x0);
          VmaJsonWriter::WriteSize(json);
          if (this_01->m_Name != (char *)0x0) {
            VmaJsonWriter::ContinueString(json," - ");
            VmaJsonWriter::ContinueString(json,this_01->m_Name);
          }
          VmaJsonWriter::EndString(json,(char *)0x0);
          VmaJsonWriter::WriteString(json,"PreferredBlockSize");
          VmaJsonWriter::WriteNumber(json,(this_01->m_BlockVector).m_PreferredBlockSize);
          VmaJsonWriter::WriteString(json,"Blocks");
          VmaBlockVector::PrintDetailedMap(&this_01->m_BlockVector,json);
          VmaJsonWriter::WriteString(json,"DedicatedAllocations");
          VmaDedicatedAllocationList::BuildStatsString(&this_01->m_DedicatedAllocations,json);
          VmaJsonWriter::EndObject(json);
        }
        pPVar2 = (PoolList *)&this_01->m_NextPool;
      }
      if (!bVar1) {
        VmaJsonWriter::EndArray(json);
      }
    }
  }
  VmaMutexLockRead::~VmaMutexLockRead(&local_40);
  VmaJsonWriter::EndObject(json);
  return;
}

Assistant:

void VmaAllocator_T::PrintDetailedMap(VmaJsonWriter& json)
{
    json.WriteString("DefaultPools");
    json.BeginObject();
    {
        for (uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
        {
            VmaBlockVector* pBlockVector = m_pBlockVectors[memTypeIndex];
            VmaDedicatedAllocationList& dedicatedAllocList = m_DedicatedAllocations[memTypeIndex];
            if (pBlockVector != VMA_NULL)
            {
                json.BeginString("Type ");
                json.ContinueString(memTypeIndex);
                json.EndString();
                json.BeginObject();
                {
                    json.WriteString("PreferredBlockSize");
                    json.WriteNumber(pBlockVector->GetPreferredBlockSize());

                    json.WriteString("Blocks");
                    pBlockVector->PrintDetailedMap(json);

                    json.WriteString("DedicatedAllocations");
                    dedicatedAllocList.BuildStatsString(json);
                }
                json.EndObject();
            }
        }
    }
    json.EndObject();

    json.WriteString("CustomPools");
    json.BeginObject();
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        if (!m_Pools.IsEmpty())
        {
            for (uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
            {
                bool displayType = true;
                size_t index = 0;
                for (VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
                {
                    VmaBlockVector& blockVector = pool->m_BlockVector;
                    if (blockVector.GetMemoryTypeIndex() == memTypeIndex)
                    {
                        if (displayType)
                        {
                            json.BeginString("Type ");
                            json.ContinueString(memTypeIndex);
                            json.EndString();
                            json.BeginArray();
                            displayType = false;
                        }

                        json.BeginObject();
                        {
                            json.WriteString("Name");
                            json.BeginString();
                            json.ContinueString_Size(index++);
                            if (pool->GetName())
                            {
                                json.ContinueString(" - ");
                                json.ContinueString(pool->GetName());
                            }
                            json.EndString();

                            json.WriteString("PreferredBlockSize");
                            json.WriteNumber(blockVector.GetPreferredBlockSize());

                            json.WriteString("Blocks");
                            blockVector.PrintDetailedMap(json);

                            json.WriteString("DedicatedAllocations");
                            pool->m_DedicatedAllocations.BuildStatsString(json);
                        }
                        json.EndObject();
                    }
                }

                if (!displayType)
                    json.EndArray();
            }
        }
    }
    json.EndObject();
}